

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void linker_copy(GlobalVars *gv)

{
  void *pvVar1;
  node *pnVar2;
  long in_RDI;
  int i;
  unsigned_long lastsecend;
  bool print_symbols_of_header;
  ObjectUnit *obj;
  Symbol *sym;
  unsigned_long maxsize;
  Section *sec;
  LinkedSection *maxls;
  LinkedSection *ls;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  LinkedSection *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  uint16_t in_stack_ffffffffffffffc6;
  void *in_stack_ffffffffffffffc8;
  ObjectUnit *ou;
  GlobalVars *in_stack_ffffffffffffffd0;
  ulong local_28;
  node *local_20;
  long *local_18;
  long *local_10;
  
  local_18 = (long *)0x0;
  local_28 = 0;
  if (*(long *)(in_RDI + 0xb0) != 0) {
    fprintf(*(FILE **)(in_RDI + 0xb0),"\n");
  }
  if (*(long *)(in_RDI + 0xa8) != 0) {
    fprintf(*(FILE **)(in_RDI + 0xa8),"\n");
  }
  for (local_10 = *(long **)(in_RDI + 0x1d8); *local_10 != 0; local_10 = (long *)*local_10) {
    in_stack_ffffffffffffffc4 = 1;
    in_stack_ffffffffffffffc6 = 0;
    in_stack_ffffffffffffffb8 = (LinkedSection *)0x0;
    if (((*(long *)(in_RDI + 0xb0) != 0) && (*(long *)local_10[0xd] != 0)) && (local_10[10] != 0)) {
      fprintf(*(FILE **)(in_RDI + 0xb0),"Copying %s:\n",local_10[3]);
    }
    if ((local_28 < (ulong)local_10[10]) || (local_28 == 0)) {
      local_28 = local_10[10];
      local_18 = local_10;
    }
    pvVar1 = alloczero(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_10[0x10] = (long)pvVar1;
    for (local_20 = (node *)local_10[0xd]; local_20->next != (node *)0x0; local_20 = local_20->next)
    {
      if ((local_10[0x10] != 0) && (local_20[4].pred != (node *)0x0)) {
        memset16(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc6,
                 (long)in_stack_ffffffffffffffb8);
        memcpy((void *)((long)&(local_20[4].next)->next + local_10[0x10]),local_20[4].pred,
               (size_t)local_20[5].next);
        in_stack_ffffffffffffffb8 =
             (LinkedSection *)((long)&(local_20[5].next)->next + (long)&(local_20[4].next)->next);
      }
      if (local_20[1].next != (node *)0x0) {
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < 0x20;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          for (pnVar2 = (&(local_20[1].next[4].pred)->next)[in_stack_ffffffffffffffb4];
              pnVar2 != (node *)0x0; pnVar2 = pnVar2[1].pred) {
            if ((pnVar2[3].pred == local_20) && (((ulong)pnVar2[4].next & 0xa00) != 0x800)) {
              if (*(char *)&pnVar2[4].next == '\x02') {
                pnVar2[3].next = (node *)((long)&(local_20[3].pred)->next + (long)pnVar2[3].next);
              }
              addtail((list *)(local_10 + 0x17),pnVar2);
              if (*(long *)(in_RDI + 0xa8) != 0) {
                if (CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) != 0) {
                  fprintf(*(FILE **)(in_RDI + 0xa8),"\nSymbols of %s:\n",local_10[3]);
                }
                print_symbol((FILE *)CONCAT26(in_stack_ffffffffffffffc6,
                                              CONCAT24(in_stack_ffffffffffffffc4,
                                                       in_stack_ffffffffffffffc0)),
                             (Symbol *)in_stack_ffffffffffffffb8);
                in_stack_ffffffffffffffc4 = 0;
                in_stack_ffffffffffffffc6 = 0;
              }
            }
          }
          in_stack_ffffffffffffffd0 = (GlobalVars *)0x0;
        }
      }
    }
  }
  if ((*(int *)(in_RDI + 0x25c) != 0) && (local_18 != (long *)0x0)) {
    if (*(long *)(in_RDI + 0xa8) != 0) {
      fprintf(*(FILE **)(in_RDI + 0xa8),"\nLinker symbols:\n");
    }
    while (pnVar2 = remhead((list *)(in_RDI + 0x1a8)), pnVar2 != (node *)0x0) {
      if (((ulong)pnVar2[4].next & 0xa00) != 0x800) {
        pnVar2[3].pred = (node *)local_18[0xd];
        addtail((list *)(local_18 + 0x17),pnVar2);
        if (*(long *)(in_RDI + 0xa8) != 0) {
          print_symbol((FILE *)CONCAT26(in_stack_ffffffffffffffc6,
                                        CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                )),(Symbol *)in_stack_ffffffffffffffb8);
        }
      }
    }
  }
  fixlnksymbols((GlobalVars *)
                CONCAT26(in_stack_ffffffffffffffc6,
                         CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                in_stack_ffffffffffffffb8);
  for (ou = *(ObjectUnit **)(in_RDI + 0x150); (ou->n).next != (node *)0x0;
      ou = (ObjectUnit *)(ou->n).next) {
    fixstabs(ou);
  }
  return;
}

Assistant:

void linker_copy(struct GlobalVars *gv)
/* Merge contents of linked sections, fix symbol offsets and
   allocate common symbol data. */
{
  struct LinkedSection *ls,*maxls=NULL;
  struct Section *sec;
  unsigned long maxsize = 0;
  struct Symbol *sym;
  struct ObjectUnit *obj;

  if (gv->trace_file)
    fprintf(gv->trace_file,"\n");
  if (gv->map_file)
    fprintf(gv->map_file,"\n");

  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    bool print_symbols_of_header = TRUE;
    unsigned long lastsecend = 0;  /* for filling gaps */

    if (gv->trace_file) {
      if (!listempty(&ls->sections) && ls->size>0)
        fprintf(gv->trace_file,"Copying %s:\n",ls->name);
    }
    if (ls->size>maxsize || maxsize==0) {  /* finds largest section */
      maxsize = ls->size;
      maxls = ls;
    }
    /* allocate memory for section, even for uninitialized ones */
    ls->data = alloczero(ls->size);

    for (sec=(struct Section *)ls->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      int i;

      if (ls->data && sec->data) {
        /* copy section contents, fill gaps */
        memset16(gv,ls->data + lastsecend,sec->filldata,
                 sec->offset - lastsecend);
        memcpy(ls->data+sec->offset,sec->data,sec->size);
        lastsecend = sec->offset + sec->size;
      }

      if (sec->obj) {
        /* find section symbols and fix their offsets */
        for (i=0; i<OBJSYMHTABSIZE; i++) {
          for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
            if (sym->relsect == sec) {
#if 0
              if (sym->type==SYM_COMMON &&
                  (!gv->dest_object || gv->alloc_common)) {
                /* delete remaining copies of common symbols */
                remove_obj_symbol(sym);
              }
#endif
              if (!((sym->flags & (SYMF_REFERENCED|SYMF_PROVIDED))
                    == SYMF_PROVIDED)) { /* ignore unrefd. provided sym. */
                if (sym->type == SYM_RELOC)
                  sym->value += sec->va;  /* was sec->offset */
                addtail(&ls->symbols,&sym->n);

                if (gv->map_file) {
                  if (print_symbols_of_header)
                    fprintf(gv->map_file,"\nSymbols of %s:\n",ls->name);
                  print_symbol(gv->map_file,sym);
                  print_symbols_of_header = FALSE;
                }
              }
            }
          }
        }
      }
    }
  }

  if (gv->use_ldscript && maxls!=NULL) {
    /* put remaining absolute linker script symbols into the
       symbol list of the largest defined section: */
    if (gv->map_file)
      fprintf(gv->map_file,"\nLinker symbols:\n");
    while (sym = (struct Symbol *)remhead(&gv->scriptsymbols)) {
      if (!((sym->flags & (SYMF_REFERENCED|SYMF_PROVIDED))
            == SYMF_PROVIDED)) {
        sym->relsect = (struct Section *)maxls->sections.first;
        addtail(&maxls->symbols,&sym->n);
        if (gv->map_file)
          print_symbol(gv->map_file,sym);
      }
    }
  }

  /* last chance to fix linker symbols */
  fixlnksymbols(gv,maxls);

  /* fix offsets of relocatable debugging symbols */
  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {
    fixstabs(obj);
  }
}